

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O2

void __thiscall mau::PacketQueue::InsertSorted(PacketQueue *this,QueueNode *node)

{
  QueueNode **ppQVar1;
  QueueNode *pQVar2;
  QueueNode *pQVar3;
  QueueNode **ppQVar4;
  
  ppQVar1 = &this->Tail;
  pQVar2 = (QueueNode *)0x0;
  ppQVar4 = ppQVar1;
  do {
    pQVar3 = *ppQVar4;
    if (pQVar3 == (QueueNode *)0x0) {
      this->Head = node;
      if (pQVar2 == (QueueNode *)0x0) {
        *ppQVar1 = node;
      }
      else {
        pQVar2->Prev = node;
      }
      pQVar3 = (QueueNode *)0x0;
LAB_0016dd5d:
      node->Next = pQVar2;
      node->Prev = pQVar3;
      return;
    }
    if (pQVar3->DeliveryUsec <= node->DeliveryUsec) {
      pQVar3->Next = node;
      if (pQVar2 == (QueueNode *)0x0) {
        *ppQVar1 = node;
      }
      else {
        pQVar2->Prev = node;
      }
      goto LAB_0016dd5d;
    }
    ppQVar4 = &pQVar3->Prev;
    pQVar2 = pQVar3;
  } while( true );
}

Assistant:

void PacketQueue::InsertSorted(QueueNode* node)
{
    const uint64_t deliveryUsec = node->DeliveryUsec;

    QueueNode* next = nullptr;

    // Insert at front or middle (based on target delivery time):
    for (QueueNode* prev = Tail; prev; next = prev, prev = prev->Prev)
    {
        // If we should insert after prev:
        if (deliveryUsec >= prev->DeliveryUsec)
        {
            if (prev) {
                prev->Next = node;
            }
            else {
                Head = node;
            }
            if (next) {
                next->Prev = node;
            }
            else {
                Tail = node;
            }
            node->Next = next;
            node->Prev = prev;

            return;
        }
    }

    // Insert at the front:
    Head = node;
    if (next) {
        next->Prev = node;
    }
    else {
        Tail = node;
    }
    node->Next = next;
    node->Prev = nullptr;
}